

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubjson_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::ubjson::basic_ubjson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
::parse(basic_ubjson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
       json_visitor *visitor,error_code *ec)

{
  stream_source<unsigned_char> *this_00;
  pointer ppVar1;
  pointer ppVar2;
  ushort uVar3;
  assertion_error *this_01;
  ulong uVar4;
  ubjson_errc __e;
  string local_48;
  
  if (this->done_ == false) {
    this_00 = &this->source_;
    do {
      if (this->more_ != true) {
        return;
      }
      ppVar1 = (this->state_stack_).
               super__Vector_base<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      switch(ppVar1[-1].mode) {
      case root:
        ppVar1[-1].mode = accept;
        goto LAB_007bc6c9;
      case accept:
        ppVar2 = (this->state_stack_).
                 super__Vector_base<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((long)ppVar1 - (long)ppVar2 != 0x20) {
          this_01 = (assertion_error *)__cxa_allocate_exception(0x10);
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"assertion \'state_stack_.size() == 1\' failed at  <> :0",
                     "");
          assertion_error::assertion_error(this_01,&local_48);
          __cxa_throw(this_01,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (ppVar1 != ppVar2) {
          (this->state_stack_).
          super__Vector_base<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
        }
        this->more_ = false;
        this->done_ = true;
        (*visitor->_vptr_basic_json_visitor[2])(visitor);
        break;
      case array:
        if (ppVar1[-1].index < ppVar1[-1].length) {
          ppVar1[-1].index = ppVar1[-1].index + 1;
          goto LAB_007bc6c9;
        }
LAB_007bc525:
        end_array(this,visitor,ec);
        break;
      case indefinite_array:
        if ((this->source_).buffer_length_ == 0) {
          stream_source<unsigned_char>::fill_buffer(this_00);
        }
        if ((this->source_).buffer_length_ == 0) {
          uVar3 = 0x100;
        }
        else {
          uVar3 = (ushort)*(this->source_).buffer_data_;
        }
        if (0xff < uVar3) {
LAB_007bc7a0:
          __e = unexpected_eof;
LAB_007bc78f:
          std::error_code::operator=(ec,__e);
          this->more_ = false;
          return;
        }
        if (uVar3 != 0x5d) {
          ppVar1 = (this->state_stack_).
                   super__Vector_base<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          uVar4 = ppVar1[-1].index + 1;
          ppVar1[-1].index = uVar4;
          if ((this->options_).max_items_ < uVar4) {
LAB_007bc78a:
            __e = max_items_exceeded;
            goto LAB_007bc78f;
          }
          goto LAB_007bc6c9;
        }
        stream_source<unsigned_char>::ignore(this_00,1);
        end_array(this,visitor,ec);
        goto LAB_007bc6d7;
      case strongly_typed_array:
        if (ppVar1[-1].length <= ppVar1[-1].index) goto LAB_007bc525;
        ppVar1[-1].index = ppVar1[-1].index + 1;
        goto LAB_007bc773;
      case map_key:
        if (ppVar1[-1].index < ppVar1[-1].length) {
          ppVar1[-1].index = ppVar1[-1].index + 1;
          read_key(this,visitor,ec);
          if (ec->_M_value != 0) {
            return;
          }
          (this->state_stack_).
          super__Vector_base<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].mode = map_value;
        }
        else {
LAB_007bc626:
          end_object(this,visitor,ec);
        }
        break;
      case map_value:
        ppVar1[-1].mode = map_key;
        goto LAB_007bc6c9;
      case strongly_typed_map_key:
        if (ppVar1[-1].length <= ppVar1[-1].index) goto LAB_007bc626;
        ppVar1[-1].index = ppVar1[-1].index + 1;
        read_key(this,visitor,ec);
        if (ec->_M_value != 0) {
          return;
        }
        (this->state_stack_).
        super__Vector_base<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].mode = strongly_typed_map_value;
        break;
      case strongly_typed_map_value:
        ppVar1[-1].mode = strongly_typed_map_key;
LAB_007bc773:
        read_value(this,visitor,ppVar1[-1].type,ec);
        goto LAB_007bc6d7;
      case indefinite_map_key:
        if ((this->source_).buffer_length_ == 0) {
          stream_source<unsigned_char>::fill_buffer(this_00);
        }
        if ((this->source_).buffer_length_ == 0) {
          uVar3 = 0x100;
        }
        else {
          uVar3 = (ushort)*(this->source_).buffer_data_;
        }
        if (0xff < uVar3) goto LAB_007bc7a0;
        if (uVar3 == 0x7d) {
          stream_source<unsigned_char>::ignore(this_00,1);
          end_object(this,visitor,ec);
          goto LAB_007bc6d7;
        }
        ppVar1 = (this->state_stack_).
                 super__Vector_base<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        uVar4 = ppVar1[-1].index + 1;
        ppVar1[-1].index = uVar4;
        if ((this->options_).max_items_ < uVar4) goto LAB_007bc78a;
        read_key(this,visitor,ec);
        if (ec->_M_value != 0) {
          return;
        }
        (this->state_stack_).
        super__Vector_base<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].mode = indefinite_map_value;
        break;
      case indefinite_map_value:
        ppVar1[-1].mode = indefinite_map_key;
LAB_007bc6c9:
        read_type_and_value(this,visitor,ec);
LAB_007bc6d7:
        if (ec->_M_value != 0) {
          return;
        }
      }
    } while (this->done_ == false);
  }
  return;
}

Assistant:

void parse(json_visitor& visitor, std::error_code& ec)
    {
        while (!done_ && more_)
        {
            switch (state_stack_.back().mode)
            {
                case parse_mode::array:
                {
                    if (state_stack_.back().index < state_stack_.back().length)
                    {
                        ++state_stack_.back().index;
                        read_type_and_value(visitor, ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                    }
                    else
                    {
                        end_array(visitor, ec);
                    }
                    break;
                }
                case parse_mode::strongly_typed_array:
                {
                    if (state_stack_.back().index < state_stack_.back().length)
                    {
                        ++state_stack_.back().index;
                        read_value(visitor, state_stack_.back().type, ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                    }
                    else
                    {
                        end_array(visitor, ec);
                    }
                    break;
                }
                case parse_mode::indefinite_array:
                {
                    auto c = source_.peek();
                    if (JSONCONS_UNLIKELY(c.eof))
                    {
                        ec = ubjson_errc::unexpected_eof;
                        more_ = false;
                        return;
                    }
                    if (c.value == jsoncons::ubjson::ubjson_type::end_array_marker)
                    {
                        source_.ignore(1);
                        end_array(visitor, ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                    }
                    else
                    {
                        if (++state_stack_.back().index > options_.max_items())
                        {
                            ec = ubjson_errc::max_items_exceeded;
                            more_ = false;
                            return;
                        }
                        read_type_and_value(visitor, ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                    }
                    break;
                }
                case parse_mode::map_key:
                {
                    if (state_stack_.back().index < state_stack_.back().length)
                    {
                        ++state_stack_.back().index;
                        read_key(visitor, ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                        state_stack_.back().mode = parse_mode::map_value;
                    }
                    else
                    {
                        end_object(visitor, ec);
                    }
                    break;
                }
                case parse_mode::map_value:
                {
                    state_stack_.back().mode = parse_mode::map_key;
                    read_type_and_value(visitor, ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        return;
                    }
                    break;
                }
                case parse_mode::strongly_typed_map_key:
                {
                    if (state_stack_.back().index < state_stack_.back().length)
                    {
                        ++state_stack_.back().index;
                        read_key(visitor, ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                        state_stack_.back().mode = parse_mode::strongly_typed_map_value;
                    }
                    else
                    {
                        end_object(visitor, ec);
                    }
                    break;
                }
                case parse_mode::strongly_typed_map_value:
                {
                    state_stack_.back().mode = parse_mode::strongly_typed_map_key;
                    read_value(visitor, state_stack_.back().type, ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        return;
                    }
                    break;
                }
                case parse_mode::indefinite_map_key:
                {
                    auto c = source_.peek();
                    if (JSONCONS_UNLIKELY(c.eof))
                    {
                        ec = ubjson_errc::unexpected_eof;
                        more_ = false;
                        return;
                    }
                    if (c.value == jsoncons::ubjson::ubjson_type::end_object_marker)
                    {
                        source_.ignore(1);
                        end_object(visitor, ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                    }
                    else
                    {
                        if (++state_stack_.back().index > options_.max_items())
                        {
                            ec = ubjson_errc::max_items_exceeded;
                            more_ = false;
                            return;
                        }
                        read_key(visitor, ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                        state_stack_.back().mode = parse_mode::indefinite_map_value;
                    }
                    break;
                }
                case parse_mode::indefinite_map_value:
                {
                    state_stack_.back().mode = parse_mode::indefinite_map_key;
                    read_type_and_value(visitor, ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        return;
                    }
                    break;
                }
                case parse_mode::root:
                {
                    state_stack_.back().mode = parse_mode::accept;
                    read_type_and_value(visitor, ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        return;
                    }
                    break;
                }
                case parse_mode::accept:
                {
                    JSONCONS_ASSERT(state_stack_.size() == 1);
                    state_stack_.clear();
                    more_ = false;
                    done_ = true;
                    visitor.flush();
                    break;
                }
            }
        }
    }